

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_3_4::Xdr::read<Imf_3_4::CharPtrIO,char_const*>(char **in,float *v)

{
  undefined8 in_RAX;
  uchar b [4];
  
  b = SUB84((ulong)in_RAX >> 0x20,0);
  CharPtrIO::readChars(in,(char *)b,4);
  *v = (float)b;
  return;
}

Assistant:

void
read (T& in, float& v)
{
    unsigned char b[4];

    readUnsignedChars<S> (in, b, 4);

    union
    {
        unsigned int i;
        float        f;
    } u;

    u.i = (b[0] & 0x000000ff) | ((b[1] << 8) & 0x0000ff00) |
          ((b[2] << 16) & 0x00ff0000) | (b[3] << 24);

    v = u.f;
}